

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
::ExportConStatus(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>_>
                  *this,int i_con,LinkRange *cnt,ItemNamer *vnam,bool add2final)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  BasicLink *pBVar4;
  char *pcVar5;
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar6;
  Buffer<char> *pBVar7;
  int iVar8;
  _func_int **pp_Var9;
  size_t size;
  size_t sVar10;
  BasicLogger *pBVar11;
  undefined3 in_register_00000081;
  char *str;
  size_t new_size;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter pr;
  MemoryWriter wrt;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4c8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4b0;
  undefined4 local_49c;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_498;
  BasicMemoryWriter<char,_std::allocator<char>_> local_488;
  BasicMemoryWriter<char,_std::allocator<char>_> local_258;
  
  local_49c = CONCAT31(in_register_00000081,add2final);
  pBVar11 = (this->super_BasicConstraintKeeper).exporter_;
  if (pBVar11 == (BasicLogger *)0x0) {
    return;
  }
  iVar8 = (*pBVar11->_vptr_BasicLogger[2])();
  if ((char)iVar8 == '\0') {
    return;
  }
  if ((this->super_BasicConstraintKeeper).exporter_ == (BasicLogger *)0x0) {
    return;
  }
  local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
  local_258.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_005c3958;
  local_258.buffer_.super_Buffer<char>.ptr_ = local_258.buffer_.data_;
  local_258.buffer_.super_Buffer<char>.size_ = 0;
  local_258.buffer_.super_Buffer<char>.capacity_ = 500;
  local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
  local_4b0.wrt_ = &local_258;
  local_4b0.kind_ = Unset;
  local_4b0.n_written_ = 0;
  pp_Var9 = (_func_int **)
            BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
  key._M_str = (char *)0x8;
  key._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_4c8,key);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = pp_Var9;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  key_00._M_str = (char *)0x5;
  key_00._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_00);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(uint)i_con;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  pBVar4 = cnt->b_;
  if (*(char *)&pBVar4->_vptr_BasicLink == '\0') goto LAB_00271512;
  key_01._M_str = (char *)0x4;
  key_01._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_01);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)pBVar4;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  local_488.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_005c3958;
  local_488.buffer_.super_Buffer<char>.ptr_ = local_488.buffer_.data_;
  local_488.buffer_.super_Buffer<char>.size_ = 0;
  local_488.buffer_.super_Buffer<char>.capacity_ = 500;
  local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
  pBVar4 = cnt->b_;
  local_488.super_BasicWriter<char>.buffer_ = &local_488.buffer_.super_Buffer<char>;
  size = strlen((char *)pBVar4);
  if (size < 0x1f5) {
    if (size != 0) goto LAB_002713f4;
  }
  else {
    fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow(&local_488.buffer_,size);
LAB_002713f4:
    memmove(local_488.buffer_.super_Buffer<char>.ptr_ + local_488.buffer_.super_Buffer<char>.size_,
            pBVar4,size);
  }
  pBVar7 = local_488.super_BasicWriter<char>.buffer_;
  sVar10 = (local_488.super_BasicWriter<char>.buffer_)->size_;
  uVar1 = sVar10 + 2;
  local_488.buffer_.super_Buffer<char>.size_ = size;
  if ((local_488.super_BasicWriter<char>.buffer_)->capacity_ < uVar1) {
    (**((Buffer<char> *)&(local_488.super_BasicWriter<char>.buffer_)->_vptr_Buffer)->_vptr_Buffer)
              (local_488.super_BasicWriter<char>.buffer_,uVar1);
    sVar10 = pBVar7->size_;
  }
  pcVar5 = pBVar7->ptr_;
  (pcVar5 + sVar10)[0] = ':';
  (pcVar5 + sVar10)[1] = ' ';
  pBVar7->size_ = uVar1;
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::PowerConeId>
            (&local_488,
             (CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::PowerConeId>
              *)(cnt + 2),vnam);
  sVar10 = (local_488.super_BasicWriter<char>.buffer_)->size_;
  if ((local_488.super_BasicWriter<char>.buffer_)->capacity_ < sVar10 + 1) {
    (**((Buffer<char> *)&(local_488.super_BasicWriter<char>.buffer_)->_vptr_Buffer)->_vptr_Buffer)()
    ;
  }
  (local_488.super_BasicWriter<char>.buffer_)->ptr_[sVar10] = '\0';
  pBVar6 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
           (local_488.super_BasicWriter<char>.buffer_)->ptr_;
  key_02._M_str = (char *)0x7;
  key_02._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_498,key_02);
  if (local_498.kind_ == Unset) {
    local_498.kind_ = Scalar;
  }
  local_4c8.wrt_ = pBVar6;
  fmt::BasicWriter<char>::write
            (&(local_498.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,(size_t)&local_4c8);
  local_498.n_written_ = local_498.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_498);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_498);
  local_488.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_005c3958;
  local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
  if (local_488.buffer_.super_Buffer<char>.ptr_ != local_488.buffer_.data_) {
    operator_delete(local_488.buffer_.super_Buffer<char>.ptr_,
                    local_488.buffer_.super_Buffer<char>.capacity_);
  }
LAB_00271512:
  uVar3 = *(uint *)&cnt[5].b_;
  key_03._M_str = (char *)0x5;
  key_03._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_03);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)uVar3;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  cVar2 = *(char *)((long)&cnt[5].ir_.beg_ + 1);
  key_04._M_str = (char *)0x6;
  key_04._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_04);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(cVar2 != '\0');
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  iVar8 = cnt[5].ir_.beg_;
  key_05._M_str = (char *)0x7;
  key_05._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_05);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)((char)iVar8 != '\0');
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  key_06._M_str = (char *)0x5;
  key_06._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_06);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(byte)local_49c;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b0);
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)0x0;
  local_488.super_BasicWriter<char>.buffer_ = (Buffer<char> *)0x0;
  fmt::BasicWriter<char>::write
            (&local_258.super_BasicWriter<char>,0x4b6c83,(void *)0x0,(size_t)&local_488);
  pBVar11 = (this->super_BasicConstraintKeeper).exporter_;
  if ((pBVar11 == (BasicLogger *)0x0) ||
     (iVar8 = (*pBVar11->_vptr_BasicLogger[2])(), (char)iVar8 == '\0')) {
    pBVar11 = (BasicLogger *)0x0;
  }
  else {
    pBVar11 = (this->super_BasicConstraintKeeper).exporter_;
  }
  BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar11,&local_258);
  local_258.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_005c3958;
  local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
  if (local_258.buffer_.super_Buffer<char>.ptr_ != local_258.buffer_.data_) {
    operator_delete(local_258.buffer_.super_Buffer<char>.ptr_,
                    local_258.buffer_.super_Buffer<char>.capacity_);
  }
  return;
}

Assistant:

void ExportConStatus(int i_con, const Container& cnt,
                       ItemNamer& vnam, bool add2final) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["index"] = i_con;
        if (*cnt.GetCon().name()) {
          jw["name"] = cnt.GetCon().name();
          {
            fmt::MemoryWriter pr;
            WriteFlatCon(pr, cnt.GetCon(), vnam);
            jw["printed"] = pr.c_str();
          }
        }
        jw["depth"] = cnt.GetDepth();
        jw["unused"] = (int)cnt.IsUnused();
        jw["bridged"] = (int)cnt.IsBridged();
        jw["final"] = (int)add2final;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }